

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O3

bool json::save<obj_var1>(ostream *out,obj_var1 *t,int tabs)

{
  SaveObject serializer;
  char local_31;
  SaveObject local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{\n",2);
  local_30.tabs = tabs + 1;
  local_30.first = true;
  local_30.out = out;
  SaveObject::process<int>(&local_30,"val1",&t->val1);
  SaveObject::process<float>(&local_30,"val2",&t->val2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  if (0 < tabs) {
    do {
      local_31 = '\t';
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_31,1);
      tabs = tabs + -1;
    } while (tabs != 0);
  }
  local_31 = '}';
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_31,1);
  return ((byte)out[*(long *)(*(long *)out + -0x18) + 0x20] & 5) == 0;
}

Assistant:

bool save(std::ostream& out, T& t, int tabs) {
	out << "{\n";
	SaveObject serializer(out, tabs + 1);
	serialize(serializer, t); // serialize should be defined for type T
	out << "\n";
	for (int i = 0; i < tabs; ++i) out << '\t';
	out << '}';
	return !out.fail();
}